

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandDetector.cpp
# Opt level: O0

HandDetector * __thiscall
HandDetector::detectHands_range(HandDetector *this,Mat *img,Scalar *lower,Scalar *upper)

{
  Matx<double,_4,_1> *in_R8;
  Mat local_108 [96];
  _OutputArray local_a8;
  _InputArray local_90;
  _InputArray local_78;
  _InputArray local_50;
  undefined1 local_31;
  Scalar *upper_local;
  Scalar *lower_local;
  Mat *img_local;
  HandDetector *this_local;
  Mat *mask;
  
  upper_local = upper;
  lower_local = lower;
  img_local = img;
  this_local = this;
  std::vector<Hand,_std::allocator<Hand>_>::clear((vector<Hand,_std::allocator<Hand>_> *)img);
  local_31 = 0;
  cv::Mat::Mat((Mat *)this);
  cv::_InputArray::_InputArray(&local_50,(Mat *)lower);
  cv::_InputArray::_InputArray<double,4,1>(&local_78,(Matx<double,_4,_1> *)upper);
  cv::_InputArray::_InputArray<double,4,1>(&local_90,in_R8);
  cv::_OutputArray::_OutputArray(&local_a8,(Mat *)this);
  cv::inRange(&local_50,&local_78,&local_90,&local_a8);
  cv::_OutputArray::~_OutputArray(&local_a8);
  cv::_InputArray::~_InputArray(&local_90);
  cv::_InputArray::~_InputArray(&local_78);
  cv::_InputArray::~_InputArray(&local_50);
  cv::Mat::Mat(local_108,(Mat *)this);
  findHandsContours((HandDetector *)img,local_108);
  cv::Mat::~Mat(local_108);
  return this;
}

Assistant:

Mat HandDetector::detectHands_range(Mat img, Scalar lower, Scalar upper) {
    hands.clear();
    Mat mask;
    inRange(img, lower, upper, mask);
    findHandsContours(mask);
    return mask;
}